

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readRgba2.cpp
# Opt level: O2

void readRgba2(char *fileName)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long sizeY;
  Array2D<Imf_3_4::Rgba> pixels;
  RgbaInputFile file;
  
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(&file,fileName,iVar2);
  piVar3 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar2 = *piVar3;
  lVar4 = (long)piVar3[1];
  iVar1 = piVar3[3];
  sizeY = ((long)piVar3[2] - (long)iVar2) + 1;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&pixels,10,sizeY);
  lVar5 = -((long)iVar2 * 8 + lVar4 * sizeY * 8);
  for (; lVar4 <= iVar1; lVar4 = lVar4 + 10) {
    Imf_3_4::RgbaInputFile::setFrameBuffer((Rgba *)&file,(long)&((pixels._data)->r)._h + lVar5,1);
    Imf_3_4::RgbaInputFile::readPixels((int)(Rgba *)&file,(int)lVar4);
    lVar5 = lVar5 + sizeY * -0x50;
  }
  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&pixels);
  Imf_3_4::RgbaInputFile::~RgbaInputFile(&file);
  return;
}

Assistant:

void
readRgba2 (const char fileName[])
{
    RgbaInputFile file (fileName);
    Box2i         dw = file.dataWindow ();

    int           width  = dw.max.x - dw.min.x + 1;
    Array2D<Rgba> pixels (10, width);

    while (dw.min.y <= dw.max.y)
    {
        file.setFrameBuffer (
            &pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);

        file.readPixels (dw.min.y, min (dw.min.y + 9, dw.max.y));

        // processPixels (pixels)

        dw.min.y += 10;
    }
}